

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

int wasm_random_digit(char *digitPtr)

{
  int iVar1;
  time_t tVar2;
  bool bVar3;
  ifstream fin;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&fin,"t10k-images-idx3-ubyte",_S_bin);
  bVar3 = (abStack_1f8[*(long *)(_fin + -0x18)] & 5) != 0;
  if (bVar3) {
    fwrite("failed to open digits file\n",0x1b,1,_stderr);
  }
  else {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    iVar1 = rand();
    std::istream::seekg(&fin,(long)((iVar1 % 10000) * 0x310 + 0x10),0);
    std::istream::read((char *)&fin,(long)digitPtr);
  }
  std::ifstream::~ifstream(&fin);
  return (uint)!bVar3;
}

Assistant:

int wasm_random_digit(char * digitPtr) {
    auto fin = std::ifstream("t10k-images-idx3-ubyte", std::ios::binary);
    if (!fin) {
        fprintf(stderr, "failed to open digits file\n");
        return 0;
    }
    srand(time(NULL));

    // Seek to a random digit: 16-byte header + 28*28 * (random 0 - 10000)
    fin.seekg(16 + MNIST_NINPUT * (rand() % MNIST_NTEST));
    fin.read(digitPtr, MNIST_NINPUT);

    return 1;
}